

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldo.c
# Opt level: O0

void luaD_reallocstack(lua_State *L,int newsize)

{
  TValue *oldstack_00;
  StkId pTVar1;
  int local_24;
  int lim;
  TValue *oldstack;
  int newsize_local;
  lua_State *L_local;
  
  oldstack_00 = L->stack;
  local_24 = L->stacksize;
  if (0xfffffffffffffff < (ulong)(long)(newsize + 1)) {
    luaM_toobig(L);
  }
  pTVar1 = (StkId)luaM_realloc_(L,L->stack,(long)L->stacksize << 4,(long)newsize << 4);
  L->stack = pTVar1;
  for (; local_24 < newsize; local_24 = local_24 + 1) {
    L->stack[local_24].tt_ = 0;
  }
  L->stacksize = newsize;
  L->stack_last = L->stack + (long)newsize + -5;
  correctstack(L,oldstack_00);
  return;
}

Assistant:

void luaD_reallocstack (lua_State *L, int newsize) {
  TValue *oldstack = L->stack;
  int lim = L->stacksize;
  lua_assert(newsize <= LUAI_MAXSTACK || newsize == ERRORSTACKSIZE);
  lua_assert(L->stack_last - L->stack == L->stacksize - EXTRA_STACK);
  luaM_reallocvector(L, L->stack, L->stacksize, newsize, TValue);
  for (; lim < newsize; lim++)
    setnilvalue(L->stack + lim); /* erase new segment */
  L->stacksize = newsize;
  L->stack_last = L->stack + newsize - EXTRA_STACK;
  correctstack(L, oldstack);
}